

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzgeom_utility.h
# Opt level: O0

void GetSideShapeFunction<pzgeom::TPZGeoTriangle>
               (int side,TPZVec<Fad<double>_> *qsiSide,TPZFMatrix<Fad<double>_> *phi,
               TPZFMatrix<Fad<double>_> *dphi)

{
  MElementType MVar1;
  ostream *poVar2;
  int in_EDI;
  stringstream sout;
  size_t in_stack_000001a8;
  char *in_stack_000001b0;
  TPZFMatrix<Fad<double>_> *in_stack_000001f0;
  TPZFMatrix<Fad<double>_> *in_stack_000001f8;
  TPZVec<Fad<double>_> *in_stack_00000200;
  MElementType sideType;
  TPZFMatrix<Fad<double>_> *in_stack_00000440;
  TPZFMatrix<Fad<double>_> *in_stack_00000448;
  TPZVec<Fad<double>_> *in_stack_00000450;
  TPZFMatrix<Fad<double>_> *in_stack_00000800;
  TPZFMatrix<Fad<double>_> *in_stack_00000808;
  TPZVec<Fad<double>_> *in_stack_00000810;
  TPZFMatrix<Fad<double>_> *in_stack_00000840;
  TPZFMatrix<Fad<double>_> *in_stack_00000848;
  TPZVec<Fad<double>_> *in_stack_00000850;
  TPZFMatrix<Fad<double>_> *in_stack_fffffffffffffdc0;
  TPZFMatrix<Fad<double>_> *in_stack_fffffffffffffdc8;
  TPZVec<Fad<double>_> *in_stack_fffffffffffffdd0;
  string local_220 [32];
  string local_200 [32];
  string local_1e0 [48];
  stringstream local_1b0 [16];
  TPZFMatrix<Fad<double>_> *in_stack_fffffffffffffe60;
  undefined4 in_stack_fffffffffffffe68;
  MElementType in_stack_fffffffffffffe6c;
  TPZVec<Fad<double>_> *in_stack_fffffffffffffe70;
  TPZFMatrix<Fad<double>_> *in_stack_fffffffffffffed0;
  TPZFMatrix<Fad<double>_> *in_stack_fffffffffffffed8;
  TPZVec<Fad<double>_> *in_stack_fffffffffffffee0;
  TPZFMatrix<Fad<double>_> *in_stack_ffffffffffffff20;
  TPZFMatrix<Fad<double>_> *in_stack_ffffffffffffff28;
  TPZVec<Fad<double>_> *in_stack_ffffffffffffff30;
  
  MVar1 = pztopology::TPZTriangle::Type(in_EDI);
  switch(MVar1) {
  case EPoint:
    pztopology::TPZPoint::TShape<Fad<double>>
              (in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8,in_stack_fffffffffffffdc0);
    break;
  case EOned:
    pztopology::TPZLine::TShape<Fad<double>>
              (in_stack_fffffffffffffe70,
               (TPZFMatrix<Fad<double>_> *)
               CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68),
               in_stack_fffffffffffffe60);
    break;
  case ETriangle:
    pztopology::TPZTriangle::TShape<Fad<double>>
              (in_stack_fffffffffffffee0,in_stack_fffffffffffffed8,in_stack_fffffffffffffed0);
    break;
  case EQuadrilateral:
    pztopology::TPZQuadrilateral::TShape<Fad<double>>
              (in_stack_00000200,in_stack_000001f8,in_stack_000001f0);
    break;
  case ETetraedro:
    pztopology::TPZTetrahedron::TShape<Fad<double>>
              (in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,in_stack_ffffffffffffff20);
    break;
  case EPiramide:
    pztopology::TPZPyramid::TShape<Fad<double>>
              (in_stack_00000810,in_stack_00000808,in_stack_00000800);
    break;
  case EPrisma:
    pztopology::TPZPrism::TShape<Fad<double>>(in_stack_00000450,in_stack_00000448,in_stack_00000440)
    ;
    break;
  case ECube:
    pztopology::TPZCube::TShape<Fad<double>>(in_stack_00000850,in_stack_00000848,in_stack_00000840);
    break;
  default:
    std::__cxx11::stringstream::stringstream(local_1b0);
    poVar2 = std::operator<<((ostream *)&stack0xfffffffffffffe60,
                             "Could not find associated shape function to the side. Details are as follows:"
                            );
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    poVar2 = std::operator<<((ostream *)&stack0xfffffffffffffe60,"Element is of type ");
    pztopology::TPZTriangle::Type();
    MElementType_Name_abi_cxx11_(in_stack_fffffffffffffe6c);
    poVar2 = std::operator<<(poVar2,local_1e0);
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string(local_1e0);
    poVar2 = std::operator<<((ostream *)&stack0xfffffffffffffe60,"Side\t");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,in_EDI);
    poVar2 = std::operator<<(poVar2," is of type\t");
    MElementType_Name_abi_cxx11_(in_stack_fffffffffffffe6c);
    poVar2 = std::operator<<(poVar2,local_200);
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string(local_200);
    poVar2 = (ostream *)std::ostream::operator<<(&std::cerr,std::endl<char,std::char_traits<char>>);
    std::__cxx11::stringstream::str();
    poVar2 = std::operator<<(poVar2,local_220);
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string(local_220);
    pzinternal::DebugStopImpl(in_stack_000001b0,in_stack_000001a8);
    std::__cxx11::stringstream::~stringstream(local_1b0);
  }
  return;
}

Assistant:

inline void GetSideShapeFunction(int side, TPZVec<Fad<REAL> > &qsiSide, TPZFMatrix<Fad<REAL> > &phi,TPZFMatrix<Fad<REAL> > &dphi ){
    MElementType  sideType = Topology::Type(side);
#ifdef PZDEBUG
    std::stringstream sout;
    REAL tol = 1e-12;
    TPZManVector<REAL,3> qsi(qsiSide.size());
    for (int i=0; i<qsi.size(); i++) {
        qsi[i] = qsiSide[i].val();
    }
    if(!IsInSideParametricDomain<Topology>(side,qsi,tol)){
        sout<<"The method expects the coordinates in the side's parametric domain. Exiting..."<<std::endl;
        PZError << "\n" << sout.str() << "\n";
        DebugStop();
    }
#endif
    switch (sideType){
        case EPoint:
            return pzgeom::TPZGeoPoint::TShape(qsiSide,phi,dphi);
        case EOned:
            return pzgeom::TPZGeoLinear::TShape(qsiSide,phi,dphi);
        case ETriangle:
            return pzgeom::TPZGeoTriangle::TShape(qsiSide,phi,dphi);
        case EQuadrilateral:
            return pzgeom::TPZGeoQuad::TShape(qsiSide,phi,dphi);
        case ETetraedro:
            return pzgeom::TPZGeoTetrahedra::TShape(qsiSide,phi,dphi);
        case EPiramide:
            return pzgeom::TPZGeoPyramid::TShape(qsiSide,phi,dphi);
        case EPrisma:
            return pzgeom::TPZGeoPrism::TShape(qsiSide,phi,dphi);
        case ECube:
            return pzgeom::TPZGeoCube::TShape(qsiSide,phi,dphi);
        default:{
            std::stringstream sout;
            sout<<"Could not find associated shape function to the side. Details are as follows:"<<std::endl;
            sout<<"Element is of type "<<MElementType_Name(Topology::Type())<<std::endl;
            sout<<"Side\t"<<side<<" is of type\t"<< MElementType_Name(sideType)<<std::endl;
            PZError<<std::endl<<sout.str()<<std::endl;
            DebugStop();
        }
    }
}